

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> * __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *this
          ,SmallVector<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>
           *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this != other) {
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
    buffer_size = 0;
    reserve(this,(other->
                 super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                 ).buffer_size);
    uVar6 = (other->
            super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
            buffer_size;
    if (uVar6 != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&(((other->
                           super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                           ).ptr)->id).id + lVar4);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(((this->
                           super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                           ).ptr)->id).id + lVar4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar5 = uVar5 + 1;
        uVar6 = (other->
                super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>)
                .buffer_size;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < uVar6);
    }
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>).
    buffer_size = uVar6;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}